

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O3

void PrintFinalStats(void *kmem,int linsolver)

{
  uint uVar1;
  long nfeSG;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long nfe;
  long nni;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  uVar1 = KINGetNumNonlinSolvIters(kmem,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumNonlinSolvIters",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumFuncEvals(kmem,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumFuncEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumLinIters(kmem,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumLinIters",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumPrecEvals(kmem,&local_30);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumPrecEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumPrecSolves(kmem,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumPrecSolves",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumLinConvFails(kmem,&local_40);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumLinConvFails",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumLinFuncEvals(kmem,&local_48);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumLinFuncEvals",
            (ulong)uVar1);
  }
  puts("Final Statistics.. ");
  printf("nni    = %5ld    nli   = %5ld\n",local_18,local_28);
  printf("nfe    = %5ld    nfeSG = %5ld\n",local_20,local_48);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n",local_38,local_30,local_40);
  if (linsolver < 3) {
    puts("\n=========================================================\n");
  }
  return;
}

Assistant:

static void PrintFinalStats(void* kmem, int linsolver)
{
  long int nni, nfe, nli, npe, nps, ncfl, nfeSG;
  int flag;

  flag = KINGetNumNonlinSolvIters(kmem, &nni);
  check_flag(&flag, "KINGetNumNonlinSolvIters", 1);
  flag = KINGetNumFuncEvals(kmem, &nfe);
  check_flag(&flag, "KINGetNumFuncEvals", 1);

  flag = KINGetNumLinIters(kmem, &nli);
  check_flag(&flag, "KINGetNumLinIters", 1);
  flag = KINGetNumPrecEvals(kmem, &npe);
  check_flag(&flag, "KINGetNumPrecEvals", 1);
  flag = KINGetNumPrecSolves(kmem, &nps);
  check_flag(&flag, "KINGetNumPrecSolves", 1);
  flag = KINGetNumLinConvFails(kmem, &ncfl);
  check_flag(&flag, "KINGetNumLinConvFails", 1);
  flag = KINGetNumLinFuncEvals(kmem, &nfeSG);
  check_flag(&flag, "KINGetNumLinFuncEvals", 1);

  printf("Final Statistics.. \n");
  printf("nni    = %5ld    nli   = %5ld\n", nni, nli);
  printf("nfe    = %5ld    nfeSG = %5ld\n", nfe, nfeSG);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n", nps, npe, ncfl);

  if (linsolver < 3)
  {
    printf("\n=========================================================\n\n");
  }
}